

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O0

void __thiscall Lodtalk::ClassBuilder::createMetaclassMethodDict(ClassBuilder *this)

{
  bool bVar1;
  MethodDictionary *pMVar2;
  Metaclass *pMVar3;
  NativeMethod *pointer;
  anon_union_8_4_0eb573b0_for_Oop_0 local_90;
  anon_union_8_4_0eb573b0_for_Oop_0 local_88;
  reference local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>
  *selectorAndMethod;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>_>_>
  *__range1;
  anon_union_8_4_0eb573b0_for_Oop_0 local_50;
  OopRef method;
  OopRef selector;
  ClassBuilder *this_local;
  
  pMVar2 = MethodDictionary::basicNativeNew(this->context);
  pMVar3 = Ref<Lodtalk::Metaclass>::operator->(&this->metaclass);
  (pMVar3->super_ClassDescription).super_Behavior.methodDict = pMVar2;
  OopRef::OopRef((OopRef *)&method.nextReference_,this->context);
  OopRef::OopRef((OopRef *)&local_50,this->context);
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>_>_>
           ::begin(&this->classSidePrimitiveMethods);
  selectorAndMethod =
       (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>
        *)std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*),_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>_>_>
          ::end(&this->classSidePrimitiveMethods);
  while( true ) {
    bVar1 = std::__detail::operator!=
                      (&__end1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>,_true>
                       ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>,_true>
                         *)&selectorAndMethod);
    if (!bVar1) break;
    local_80 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>,_false,_true>
               ::operator*(&__end1);
    local_88 = (anon_union_8_4_0eb573b0_for_Oop_0)
               ByteSymbol::fromNative(this->context,&local_80->first);
    OopRef::operator=((OopRef *)&method.nextReference_,(Oop *)&local_88);
    pointer = NativeMethod::create(this->context,local_80->second);
    local_90 = (anon_union_8_4_0eb573b0_for_Oop_0)Oop::fromPointer(pointer);
    OopRef::operator=((OopRef *)&local_50,(Oop *)&local_90);
    pMVar3 = Ref<Lodtalk::Metaclass>::operator->(&this->metaclass);
    MethodDictionary::atPut
              ((pMVar3->super_ClassDescription).super_Behavior.methodDict,this->context,
               (Oop)method.nextReference_,(Oop)local_50);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_(*)(Lodtalk::InterpreterProxy_*)>,_false,_true>
    ::operator++(&__end1);
  }
  OopRef::~OopRef((OopRef *)&local_50);
  OopRef::~OopRef((OopRef *)&method.nextReference_);
  return;
}

Assistant:

void ClassBuilder::createMetaclassMethodDict()
{
    metaclass->methodDict = MethodDictionary::basicNativeNew(context);
    OopRef selector(context);
    OopRef method(context);
    for(auto &selectorAndMethod : classSidePrimitiveMethods)
    {
        selector = ByteSymbol::fromNative(context, selectorAndMethod.first);
        method = Oop::fromPointer(NativeMethod::create(context, selectorAndMethod.second));
        metaclass->methodDict->atPut(context, selector.oop, method.oop);
    }
}